

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.h
# Opt level: O2

void __thiscall TPZFront<float>::STensorProductMTData::WorkDone(STensorProductMTData *this)

{
  int iVar1;
  
  std::mutex::lock(&this->fMutexWorkDoneCS);
  iVar1 = this->fWorkDoneCount + 1;
  this->fWorkDoneCount = iVar1;
  if (iVar1 == (int)((ulong)((long)(this->fThreads).
                                   super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->fThreads).
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 3)) {
    TPZSemaphore::Post(&this->fWorkDoneSem);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->fMutexWorkDoneCS);
  return;
}

Assistant:

void WorkDone(){
			std::scoped_lock<std::mutex> lck(fMutexWorkDoneCS);
      
			fWorkDoneCount++;
			if(fWorkDoneCount == NThreads()){
        fWorkDoneSem.Post();
			}
		}